

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

bool __thiscall wabt::anon_unknown_19::BinaryReader::IsConcreteType(BinaryReader *this,Type type)

{
  Type type_local;
  BinaryReader *this_local;
  
  if (type == V128) {
    this_local._7_1_ = Features::simd_enabled(&this->options_->features);
  }
  else if ((uint)(type + ~V128) < 4) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BinaryReader::IsConcreteType(Type type) {
  switch (type) {
    case Type::I32:
    case Type::I64:
    case Type::F32:
    case Type::F64:
      return true;

    case Type::V128:
      return options_.features.simd_enabled();

    default:
      return false;
  }
}